

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_search_start(bitstream *str)

{
  int iVar1;
  uint32_t local_20;
  int local_1c;
  uint32_t bit;
  int nzbit;
  bitstream *str_local;
  
  _bit = str;
  if (str->dir == VS_DECODE) {
    if ((str->type == VS_H261) || (str->type == VS_H263)) {
      local_1c = 0x10;
      if (str->type == VS_H261) {
        local_1c = 0xf;
      }
      local_20 = 0;
      do {
        if ((_bit->hasbyte == 0) && (_bit->bytesnum <= _bit->bytepos)) {
          return 0;
        }
        if (local_1c <= _bit->zero_bits) {
          return 1;
        }
        iVar1 = vs_bit(_bit,&local_20);
      } while (iVar1 == 0);
      str_local._4_4_ = 0;
    }
    else {
      str->hasbyte = 0;
      str->bitpos = 7;
      while (str->bytepos < str->bytesnum) {
        if ((str->zero_bytes == 2) && (str->bytes[str->bytepos] == '\x01')) {
          return 1;
        }
        if (str->bytes[str->bytepos] == '\0') {
          if (str->zero_bytes != 2) {
            str->zero_bytes = str->zero_bytes + 1;
          }
        }
        else {
          str->zero_bytes = 0;
        }
        str->bytepos = str->bytepos + 1;
      }
      str_local._4_4_ = 0;
    }
  }
  else {
    fprintf(_stderr,"vs_search_start called in encode mode!\n");
    str_local._4_4_ = -1;
  }
  return str_local._4_4_;
}

Assistant:

int vs_search_start(struct bitstream *str) {
	if (str->dir != VS_DECODE) {
		fprintf (stderr, "vs_search_start called in encode mode!\n");
		return -1;
	}
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		uint32_t bit = 0;

		while (1) {
			if (!str->hasbyte && str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bits >= nzbit)
				return 1;
			if (vs_bit(str, &bit)) return 0;
		}
	} else {
		str->hasbyte = 0;
		str->bitpos = 7;
		while (1) {
			if (str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bytes == 2 && str->bytes[str->bytepos] == 1)
				return 1;
			if (str->bytes[str->bytepos] == 0) {
				if (str->zero_bytes != 2)
					str->zero_bytes++;
			} else {
				str->zero_bytes = 0;
			}
			str->bytepos++;
		}
	}
}